

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglbuffer.cpp
# Opt level: O0

ssize_t __thiscall QOpenGLBuffer::write(QOpenGLBuffer *this,int __fd,void *__buf,size_t __n)

{
  GLuint GVar1;
  QOpenGLBufferPrivate *pQVar2;
  undefined4 extraout_var;
  QOpenGLBufferPrivate *extraout_RAX;
  undefined4 uVar3;
  QOpenGLBufferPrivate *d;
  QOpenGLBufferPrivate *size;
  undefined4 in_stack_ffffffffffffffe0;
  GLenum target;
  undefined4 in_stack_fffffffffffffff0;
  
  target = (GLenum)((ulong)__buf >> 0x20);
  uVar3 = (undefined4)__n;
  pQVar2 = d_func((QOpenGLBuffer *)0x131674);
  if (pQVar2->guard != (QOpenGLSharedResourceGuard *)0x0) {
    size = pQVar2;
    GVar1 = QOpenGLSharedResourceGuard::id(pQVar2->guard);
    pQVar2 = (QOpenGLBufferPrivate *)CONCAT44(extraout_var,GVar1);
    if (GVar1 != 0) {
      QOpenGLFunctions::glBufferSubData
                ((QOpenGLFunctions *)CONCAT44(__fd,in_stack_fffffffffffffff0),target,
                 CONCAT44(uVar3,in_stack_ffffffffffffffe0),(qopengl_GLsizeiptr)size,(void *)0x1316b8
                );
      pQVar2 = extraout_RAX;
    }
  }
  return (ssize_t)pQVar2;
}

Assistant:

void QOpenGLBuffer::write(int offset, const void *data, int count)
{
#ifndef QT_NO_DEBUG
    if (!isCreated())
        qWarning("QOpenGLBuffer::write(): buffer not created");
#endif
    Q_D(QOpenGLBuffer);
    if (d->guard && d->guard->id())
        d->funcs->glBufferSubData(d->type, offset, count, data);
}